

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_projection.hpp
# Opt level: O0

Matrix4<float> *
eos::render::perspective<float>
          (Matrix4<float> *__return_storage_ptr__,float fov_y,float aspect,float z_near,float z_far)

{
  Scalar *pSVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_2c [8];
  float local_24;
  float local_20;
  float tan_half_fov_y;
  float z_far_local;
  float z_near_local;
  float aspect_local;
  float fov_y_local;
  Matrix4<float> *result;
  
  local_20 = z_far;
  tan_half_fov_y = z_near;
  z_far_local = aspect;
  z_near_local = fov_y;
  _aspect_local = __return_storage_ptr__;
  dVar2 = std::tan((double)(ulong)(uint)(fov_y / 2.0));
  local_24 = SUB84(dVar2,0);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Zero();
  Eigen::Matrix<float,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            ((Matrix<float,4,4,0,4,4> *)__return_storage_ptr__,local_2c);
  fVar3 = z_far_local * local_24;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                      __return_storage_ptr__,0,0);
  *pSVar1 = 1.0 / fVar3;
  fVar3 = 1.0 / local_24;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                      __return_storage_ptr__,1,1);
  *pSVar1 = fVar3;
  fVar3 = local_20 + tan_half_fov_y;
  fVar4 = local_20 - tan_half_fov_y;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                      __return_storage_ptr__,2,2);
  *pSVar1 = -fVar3 / fVar4;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                      __return_storage_ptr__,3,2);
  *pSVar1 = -1.0;
  fVar3 = local_20 * 2.0 * tan_half_fov_y;
  fVar4 = local_20 - tan_half_fov_y;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                      __return_storage_ptr__,2,3);
  *pSVar1 = -fVar3 / fVar4;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4<T> perspective(T fov_y, T aspect, T z_near, T z_far)
{
    // Will this assert work? std::abs probably won't work on T?
    // assert(abs(aspect - std::numeric_limits<T>::epsilon()) > static_cast<T>(0));

    // Note: We want to use std::tan() for floating point types, and for users not using Ceres. However when
    // using the function with Ceres's auto-diff, we need to use ceres::tan(). We might need an extra "using
    // ceres::tan" here.
    using std::tan;
    const T tan_half_fov_y = tan(fov_y / static_cast<T>(2));

    Eigen::Matrix4<T> result = Eigen::Matrix4<T>::Zero(); // Note: Zero() is correct.
    result(0, 0) = static_cast<T>(1) / (aspect * tan_half_fov_y);
    result(1, 1) = static_cast<T>(1) / (tan_half_fov_y);
    result(2, 2) = -(z_far + z_near) / (z_far - z_near);
    result(3, 2) = -static_cast<T>(1);
    result(2, 3) = -(static_cast<T>(2) * z_far * z_near) / (z_far - z_near);
    return result;
}